

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O3

bool google::protobuf::internal::ReflectionOps::IsInitialized(Message *message)

{
  FieldDescriptor *this;
  bool bVar1;
  bool bVar2;
  byte extraout_AL;
  byte bVar3;
  int iVar4;
  Reflection *this_00;
  Descriptor *pDVar5;
  MapFieldBase *this_01;
  MessageLite *pMVar6;
  string *psVar7;
  undefined1 uVar8;
  undefined8 in_RCX;
  long lVar9;
  int index;
  pointer ppFVar10;
  Metadata MVar11;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  MapIterator iter;
  MapIterator end;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_108;
  MapIterator local_e8;
  pointer local_90;
  MapIterator local_88;
  
  MVar11 = Message::GetMetadata(message);
  pDVar5 = MVar11.descriptor;
  this_00 = GetReflectionOrDie(message);
  iVar4 = pDVar5->field_count_;
  if (0 < (long)iVar4) {
    lVar9 = 0;
    do {
      uVar8 = (undefined1)in_RCX;
      if (pDVar5->field_count_ <= lVar9) {
        IsInitialized();
LAB_002f3a3b:
        IsInitialized();
        bVar3 = extraout_AL;
        goto LAB_002f3a48;
      }
      bVar1 = FieldDescriptor::is_required(pDVar5->fields_ + lVar9);
      uVar8 = (undefined1)in_RCX;
      if (bVar1) {
        if (pDVar5->field_count_ <= lVar9) goto LAB_002f3a3b;
        bVar1 = Reflection::HasField(this_00,message,pDVar5->fields_ + lVar9);
        if (!bVar1) {
          return false;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar4);
  }
  local_108.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pDVar5->options_->field_0)._impl_.map_entry_ == true) {
    local_e8.iter_.node_ = (NodeBase *)Descriptor::map_value(pDVar5);
    std::
    vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
    ::_M_assign_aux<google::protobuf::FieldDescriptor_const*const*>
              ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                *)&local_108,&local_e8);
  }
  else {
    Reflection::ListFields(this_00,message,&local_108);
  }
  local_90 = local_108.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppFVar10 = local_108.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (local_108.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_108.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = true;
  }
  else {
    do {
      this = *ppFVar10;
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this->type_ * 4) == 10) {
        if ((this->type_ == 0xb) && (bVar1 = FieldDescriptor::is_map_message_type(this), bVar1)) {
          pDVar5 = FieldDescriptor::message_type(this);
          if ((long)pDVar5->field_count_ < 2) {
            psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                               (1,(long)pDVar5->field_count_,"index < field_count()");
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_e8,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0x9f4,*(undefined8 *)(psVar7 + 8),*(undefined8 *)psVar7);
            goto LAB_002f3aac;
          }
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pDVar5->fields_[1].type_ * 4) ==
              10) {
            this_01 = Reflection::GetMapData(this_00,message,this);
            bVar1 = MapFieldBase::IsMapValid(this_01);
            if (!bVar1) goto LAB_002f390f;
            MapIterator::MapIterator(&local_e8,message,this);
            MapIterator::MapIterator(&local_88,message,this);
            MapFieldBase::MapBegin(this_01,&local_e8);
            MapFieldBase::MapEnd(this_01,&local_88);
            while (bVar1 = MapFieldBase::EqualIterator(local_e8.map_,&local_e8,&local_88), !bVar1) {
              pMVar6 = &MapValueConstRef::GetMessageValue(&local_e8.value_.super_MapValueConstRef)->
                        super_MessageLite;
              bVar2 = MessageLite::IsInitialized(pMVar6);
              if (!bVar2) break;
              MapFieldBase::IncreaseIterator(local_e8.map_,&local_e8);
            }
            if ((local_88.key_.type_ == CPPTYPE_STRING) &&
               (local_88.key_.val_._0_8_ != (undefined1 *)((long)&local_88.key_.val_ + 0x10))) {
              operator_delete((void *)local_88.key_.val_.int64_value,local_88.key_.val_._16_8_ + 1);
            }
            if ((local_e8.key_.type_ == CPPTYPE_STRING) &&
               (local_e8.key_.val_._0_8_ != (undefined1 *)((long)&local_e8.key_.val_ + 0x10))) {
              operator_delete((void *)local_e8.key_.val_.int64_value,local_e8.key_.val_._16_8_ + 1);
            }
            goto joined_r0x002f3989;
          }
        }
        else {
LAB_002f390f:
          bVar3 = this->field_0x1;
          uVar8 = (bVar3 & 0x20) >> 5;
          if (0xbf < bVar3 != (bool)uVar8) goto LAB_002f3a48;
          if ((bVar3 & 0x20) == 0) {
            pMVar6 = &Reflection::GetMessage(this_00,message,this,(MessageFactory *)0x0)->
                      super_MessageLite;
            bVar1 = MessageLite::IsInitialized(pMVar6);
joined_r0x002f3989:
            if (!bVar1) {
LAB_002f39f3:
              bVar1 = false;
              goto LAB_002f3a05;
            }
          }
          else {
            iVar4 = Reflection::FieldSize(this_00,message,this);
            if (0 < iVar4) {
              index = 0;
              do {
                pMVar6 = &Reflection::GetRepeatedMessage(this_00,message,this,index)->
                          super_MessageLite;
                bVar1 = MessageLite::IsInitialized(pMVar6);
                if (!bVar1) goto LAB_002f39f3;
                index = index + 1;
              } while (iVar4 != index);
            }
          }
        }
      }
      ppFVar10 = ppFVar10 + 1;
    } while (ppFVar10 != local_90);
    bVar1 = true;
  }
LAB_002f3a05:
  if (local_108.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
LAB_002f3a48:
  psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                     ((bool)uVar8,0xbf < bVar3,"is_repeated_ == label() == LABEL_REPEATED");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_e8,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
             ,0xab7,*(undefined8 *)(psVar7 + 8),*(undefined8 *)psVar7);
LAB_002f3aac:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_e8);
}

Assistant:

bool ReflectionOps::IsInitialized(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = GetReflectionOrDie(message);

  // Check required fields of this message.
  {
    const int field_count = descriptor->field_count();
    for (int i = 0; i < field_count; i++) {
      if (descriptor->field(i)->is_required()) {
        if (!reflection->HasField(message, descriptor->field(i))) {
          return false;
        }
      }
    }
  }

  // Check that sub-messages are initialized.
  std::vector<const FieldDescriptor*> fields;
  // Should be safe to skip stripped fields because required fields are not
  // stripped.
  if (descriptor->options().map_entry()) {
    // MapEntry objects always check the value regardless of has bit.
    // We don't need to bother with the key.
    fields = {descriptor->map_value()};
  } else {
    reflection->ListFields(message, &fields);
  }
  for (const FieldDescriptor* field : fields) {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {

      if (field->is_map()) {
        const FieldDescriptor* value_field = field->message_type()->field(1);
        if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          const MapFieldBase* map_field =
              reflection->GetMapData(message, field);
          if (map_field->IsMapValid()) {
            MapIterator iter(const_cast<Message*>(&message), field);
            MapIterator end(const_cast<Message*>(&message), field);
            for (map_field->MapBegin(&iter), map_field->MapEnd(&end);
                 iter != end; ++iter) {
              if (!iter.GetValueRef().GetMessageValue().IsInitialized()) {
                return false;
              }
            }
            continue;
          }
        } else {
          continue;
        }
      }

      if (field->is_repeated()) {
        int size = reflection->FieldSize(message, field);

        for (int j = 0; j < size; j++) {
          if (!reflection->GetRepeatedMessage(message, field, j)
                   .IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!reflection->GetMessage(message, field).IsInitialized()) {
          return false;
        }
      }
    }
  }

  return true;
}